

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O3

vector<folding_info,_std::allocator<folding_info>_> *
read_CaseFolding_txt
          (vector<folding_info,_std::allocator<folding_info>_> *__return_storage_ptr__,
          char *filename)

{
  pointer *ppfVar1;
  char *pcVar2;
  iterator __position;
  char cVar3;
  int iVar4;
  folding_info info;
  string line;
  container_type split_line;
  ifstream file;
  folding_info local_278;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_270;
  long local_268;
  char local_260;
  undefined7 uStack_25f;
  container_type local_250;
  long local_238 [4];
  int aiStack_218 [122];
  
  (__return_storage_ptr__->super__Vector_base<folding_info,_std::allocator<folding_info>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<folding_info,_std::allocator<folding_info>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<folding_info,_std::allocator<folding_info>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream((istream *)local_238,filename,_S_in);
  if (*(int *)((long)aiStack_218 + *(long *)(local_238[0] + -0x18)) == 0) {
    do {
      local_268 = 0;
      local_260 = '\0';
      local_270._M_current = &local_260;
      cVar3 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_270,cVar3);
      jessilib::
      split<std::vector,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_char_*,_const_char_*>
                (&local_250,local_270,
                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(local_270._M_current + local_268),"; ","");
      if (0x40 < (ulong)((long)local_250.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_250.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(local_250.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1,"C");
        if (iVar4 != 0) {
          iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(local_250.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 1,"S");
          if (iVar4 != 0) goto LAB_00200ba3;
        }
        pcVar2 = ((local_250.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
        std::from_chars<unsigned_int>
                  (pcVar2,pcVar2 + (local_250.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_string_length,
                   &local_278.in_codepoint,0x10);
        pcVar2 = local_250.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
        std::from_chars<unsigned_int>
                  (pcVar2,pcVar2 + local_250.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length,
                   &local_278.out_codepoint,0x10);
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<folding_info,_std::allocator<folding_info>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->super__Vector_base<folding_info,_std::allocator<folding_info>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<folding_info,std::allocator<folding_info>>::
          _M_realloc_insert<folding_info_const&>
                    ((vector<folding_info,std::allocator<folding_info>> *)__return_storage_ptr__,
                     __position,&local_278);
        }
        else {
          *__position._M_current = local_278;
          ppfVar1 = &(__return_storage_ptr__->
                     super__Vector_base<folding_info,_std::allocator<folding_info>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppfVar1 = *ppfVar1 + 1;
        }
      }
LAB_00200ba3:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_250);
      if (local_270._M_current != &local_260) {
        operator_delete(local_270._M_current,CONCAT71(uStack_25f,local_260) + 1);
      }
    } while (*(int *)((long)aiStack_218 + *(long *)(local_238[0] + -0x18)) == 0);
  }
  std::ifstream::~ifstream(local_238);
  return __return_storage_ptr__;
}

Assistant:

std::vector<folding_info> read_CaseFolding_txt(const char* filename = JESSITEST_DATA_DIR "CaseFolding.txt") {
	std::vector<folding_info> result;
	std::ifstream file{ filename };

	while (file.good() && !file.eof()) {
		std::string line;
		std::getline(file, line);
		auto split_line = jessilib::split(line, "; "sv);
		if (split_line.size() < 3) {
			continue;
		}

		// From CaseFolding.txt usage; we're doing simple case folding:
		// "A. To do a simple case folding, use the mappings with status C + S."
		// "B. To do a full case folding, use the mappings with status C + F."
		if (split_line[1] == "C" || split_line[1] == "S") {
			folding_info info;
			std::from_chars(split_line[0].data(), split_line[0].data() + split_line[0].size(), info.in_codepoint, 16);
			std::from_chars(split_line[2].data(), split_line[2].data() + split_line[2].size(), info.out_codepoint, 16);
			result.push_back(info);
		}
		//else {
		//	std::cout << "ignoring: " << line << std::endl;
		//}
	}

	return result;
}